

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

State * __thiscall despot::Adventurer::CreateStartState(Adventurer *this,string type)

{
  ulong uVar1;
  State *this_00;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)despot::Random::NextDouble();
  uVar1 = 0;
  uVar2 = (ulong)(uint)this->num_goals_;
  if (this->num_goals_ < 1) {
    uVar2 = uVar1;
  }
  dVar4 = 0.0;
  do {
    if (uVar2 == uVar1) {
LAB_0010b609:
      this_00 = (State *)operator_new(0x20);
      AdventurerState::AdventurerState((AdventurerState *)this_00,(int)uVar2 * this->size_);
      return this_00;
    }
    dVar4 = dVar4 + (this->goal_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar1];
    if (dVar3 <= dVar4) {
      uVar2 = uVar1 & 0xffffffff;
      goto LAB_0010b609;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

State* Adventurer::CreateStartState(string type) const {
	double prob = Random::RANDOM.NextDouble();
	int goal = 0;
	double sum = 0;
	for (; goal < num_goals_; goal++) {
		sum += goal_prob_[goal];
		if (sum >= prob)
			break;
	}
	AdventurerState* state = new AdventurerState(goal * size_);
	return state;
}